

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_mv_merge.c
# Opt level: O2

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,UWORD32 *pu4_top_pu_idx,UWORD32 *pu4_left_pu_idx,
                    WORD32 left_nbr_4x4_strd,pu_t *ps_pu,WORD32 part_mode,WORD32 part_idx,
                    WORD32 part_wd,WORD32 part_ht,WORD32 part_pos_x,WORD32 part_pos_y,
                    WORD32 single_mcl_flag,WORD32 lb_avail,WORD32 l_avail,WORD32 tr_avail,
                    WORD32 t_avail,WORD32 tl_avail)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  slice_header_t *psVar9;
  undefined4 uVar10;
  bool bVar11;
  WORD8 WVar12;
  WORD8 WVar13;
  mv_t mVar14;
  mv_t mVar15;
  WORD32 WVar16;
  WORD32 WVar17;
  uint uVar18;
  uint uVar19;
  pu_t *ps_pu_1;
  ulong uVar20;
  char cVar21;
  undefined4 uVar23;
  undefined8 uVar22;
  pu_t *ps_pu_2;
  int iVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  WORD8 WVar28;
  uint uVar29;
  int iVar30;
  pu_t *ppVar31;
  int iVar32;
  pu_t *ps_pu_2_00;
  uint uVar33;
  bool bVar34;
  bool bVar35;
  mv_t as_mv_col [2];
  WORD32 avail_col_flag [2];
  pu_t as_pu_merge_list [5];
  
  psVar9 = ps_mv_ctxt->ps_slice_hdr;
  lVar26 = 0x4f8;
  if (psVar9->i1_slice_type == '\x01') {
    lVar26 = 0x378;
  }
  bVar2 = ps_mv_ctxt->ps_pps->i1_log2_parallel_merge_level;
  ppVar31 = ps_mv_ctxt->ps_pic_pu;
  ps_pu_1 = ppVar31 + (int)pu4_left_pu_idx[(part_ht + -1 >> 2) * left_nbr_4x4_strd];
  uVar29 = 0;
  if (l_avail == 0) {
    bVar34 = false;
  }
  else {
    bVar34 = (ps_pu_1->field_0xe & 1) == 0;
  }
  iVar24 = part_pos_x >> (bVar2 & 0x1f);
  iVar32 = part_pos_y >> (bVar2 & 0x1f);
  iVar30 = part_pos_x + -1;
  uVar25 = *(uint *)&ps_pu->field_0xc;
  uVar33 = uVar25 >> 0x14 & 7;
  bVar35 = true;
  if ((bVar34) &&
     (part_pos_y + part_ht + -1 >> (bVar2 & 0x1f) != iVar32 || iVar30 >> (bVar2 & 0x1f) != iVar24))
  {
    if (((part_idx == 1 && single_mcl_flag == 0) && ((uint)part_mode < 8)) &&
       (bVar34 = true, (0xc4U >> (part_mode & 0x1fU) & 1) != 0)) goto LAB_0011db97;
    uVar22 = *(undefined8 *)&(ps_pu_1->mv).i1_l0_ref_idx;
    as_pu_merge_list[0].mv.s_l0_mv = (ps_pu_1->mv).s_l0_mv;
    as_pu_merge_list[0].mv.s_l1_mv = (ps_pu_1->mv).s_l1_mv;
    as_pu_merge_list[0].mv.i1_l0_ref_idx = (WORD8)uVar22;
    as_pu_merge_list[0].mv.i1_l1_ref_idx = SUB81(uVar22,1);
    as_pu_merge_list[0].mv.i1_l0_ref_pic_buf_id = SUB81(uVar22,2);
    as_pu_merge_list[0].mv.i1_l1_ref_pic_buf_id = SUB81(uVar22,3);
    as_pu_merge_list[0]._12_4_ = SUB84(uVar22,4);
    if (uVar33 != 0) {
      uVar29 = 1;
      bVar34 = false;
      goto LAB_0011db97;
    }
    mVar14 = (ps_pu_1->mv).s_l0_mv;
    mVar15 = (ps_pu_1->mv).s_l1_mv;
    WVar28 = (ps_pu_1->mv).i1_l1_ref_idx;
    WVar12 = (ps_pu_1->mv).i1_l0_ref_pic_buf_id;
    WVar13 = (ps_pu_1->mv).i1_l1_ref_pic_buf_id;
    (ps_pu->mv).i1_l0_ref_idx = (ps_pu_1->mv).i1_l0_ref_idx;
    (ps_pu->mv).i1_l1_ref_idx = WVar28;
    (ps_pu->mv).i1_l0_ref_pic_buf_id = WVar12;
    (ps_pu->mv).i1_l1_ref_pic_buf_id = WVar13;
    (ps_pu->mv).s_l0_mv = mVar14;
    (ps_pu->mv).s_l1_mv = mVar15;
    as_pu_merge_list[0]._12_4_ = SUB84(uVar22,4);
LAB_0011e1a5:
    *(uint *)&ps_pu->field_0xc = uVar25 & 0xfff9ffff | as_pu_merge_list[0]._12_4_ & 0x60000;
  }
  else {
    bVar34 = true;
LAB_0011db97:
    iVar1 = part_pos_y + -1;
    ps_pu_2 = ppVar31 + (int)pu4_top_pu_idx[part_wd + -1 >> 2];
    uVar19 = uVar29;
    if ((t_avail == 0) || ((*(uint *)&ps_pu_2->field_0xc >> 0x10 & 1) != 0)) {
LAB_0011dc3a:
      bVar11 = false;
      bVar35 = true;
LAB_0011dc3f:
      if (((tr_avail == 0) ||
          (ps_pu_2_00 = ppVar31 + (int)pu4_top_pu_idx[part_wd >> 2],
          (*(uint *)&ps_pu_2_00->field_0xc >> 0x10 & 1) != 0)) ||
         (iVar1 >> (bVar2 & 0x1f) == iVar32 && part_pos_x + part_wd >> (bVar2 & 0x1f) == iVar24)) {
LAB_0011dca1:
        if (((lb_avail != 0) &&
            (ps_pu_2_00 = ppVar31 + (int)pu4_left_pu_idx[(part_ht >> 2) * left_nbr_4x4_strd],
            (*(uint *)&ps_pu_2_00->field_0xc >> 0x10 & 1) == 0)) &&
           (part_pos_y + part_ht >> (bVar2 & 0x1f) != iVar32 || iVar30 >> (bVar2 & 0x1f) != iVar24))
        {
          if (bVar34) {
            uVar19 = uVar19 + 1;
          }
          else {
            uVar18 = ihevcd_compare_pu_t(ps_pu_1,ps_pu_2_00);
            uVar19 = (uVar18 ^ 1) + uVar19;
            if (uVar18 != 0) goto LAB_0011dd18;
          }
          uVar20 = (ulong)(uVar29 << 4);
          uVar22 = *(undefined8 *)&(ps_pu_2_00->mv).i1_l0_ref_idx;
          *(undefined8 *)((long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20) =
               *(undefined8 *)&ps_pu_2_00->mv;
          *(undefined8 *)(&as_pu_merge_list[0].mv.i1_l0_ref_idx + uVar20) = uVar22;
          if (uVar29 == uVar33) goto LAB_0011df0f;
          uVar29 = uVar29 + 1;
        }
LAB_0011dd18:
        if (((tl_avail != 0) &&
            (ppVar31 = ppVar31 + (int)pu4_top_pu_idx[-1], (ppVar31->field_0xe & 1) == 0)) &&
           ((iVar32 != iVar1 >> (bVar2 & 0x1f) || iVar24 != iVar30 >> (bVar2 & 0x1f) &&
            (uVar19 != 4)))) {
          if (bVar34) {
            uVar19 = 1;
          }
          else {
            uVar19 = ihevcd_compare_pu_t(ps_pu_1,ppVar31);
            uVar19 = uVar19 ^ 1;
          }
          if (bVar11 && uVar19 != 0) {
            uVar19 = ihevcd_compare_pu_t(ps_pu_2,ppVar31);
            uVar19 = uVar19 ^ 1;
          }
          if (uVar19 != 0) {
            uVar20 = (ulong)(uVar29 << 4);
            uVar22 = *(undefined8 *)&(ppVar31->mv).i1_l0_ref_idx;
            *(undefined8 *)((long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20) =
                 *(undefined8 *)&ppVar31->mv;
            *(undefined8 *)(&as_pu_merge_list[0].mv.i1_l0_ref_idx + uVar20) = uVar22;
            if (uVar29 == uVar33) {
              lVar26 = (long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20;
              uVar22._0_2_ = (ppVar31->mv).s_l0_mv.i2_mvx;
              uVar22._2_2_ = (ppVar31->mv).s_l0_mv.i2_mvy;
              uVar22._4_2_ = (ppVar31->mv).s_l1_mv.i2_mvx;
              uVar22._6_2_ = (ppVar31->mv).s_l1_mv.i2_mvy;
              uVar23._0_1_ = (ppVar31->mv).i1_l0_ref_idx;
              uVar23._1_1_ = (ppVar31->mv).i1_l1_ref_idx;
              uVar23._2_1_ = (ppVar31->mv).i1_l0_ref_pic_buf_id;
              uVar23._3_1_ = (ppVar31->mv).i1_l1_ref_pic_buf_id;
              goto LAB_0011e371;
            }
            uVar29 = uVar29 + 1;
          }
        }
        avail_col_flag[0] = 0;
        avail_col_flag[1] = 0;
        ihevcd_collocated_mvp
                  (ps_mv_ctxt,ps_pu,as_mv_col,avail_col_flag,0,part_pos_x + part_wd,
                   part_pos_y + part_ht);
        WVar16 = avail_col_flag[0];
        WVar17 = avail_col_flag[1];
        bVar35 = true;
        bVar34 = true;
        if (avail_col_flag[0] == 0 && avail_col_flag[1] == 0) {
LAB_0011e09c:
          ihevcd_collocated_mvp
                    (ps_mv_ctxt,ps_pu,as_mv_col,avail_col_flag,0,(part_wd >> 1) + part_pos_x,
                     (part_ht >> 1) + part_pos_y);
          if (bVar34) {
            *(mv_t *)((long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + (ulong)(uVar29 << 4)) =
                 as_mv_col[0];
          }
          if (bVar35) {
            *(mv_t *)((long)&as_pu_merge_list[0].mv.s_l1_mv.i2_mvx + (ulong)(uVar29 << 4)) =
                 as_mv_col[1];
          }
          bVar34 = WVar16 != 0 || avail_col_flag[0] != 0;
          avail_col_flag[1] = WVar17 | avail_col_flag[1];
        }
        else {
          *(ulong *)((long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + (ulong)(uVar29 << 4)) =
               CONCAT44(as_mv_col[1],as_mv_col[0]);
          bVar34 = avail_col_flag[0] == 0;
          bVar35 = avail_col_flag[1] == 0;
          if (bVar34 || bVar35) goto LAB_0011e09c;
          bVar34 = true;
        }
        uVar19 = uVar29 << 4;
        *(undefined2 *)(&as_pu_merge_list[0].mv.i1_l0_ref_idx + uVar19) = 0;
        uVar25 = 0x20000;
        if (bVar34 != false) {
          uVar25 = (uint)(avail_col_flag[1] != 0U) << 0x12;
        }
        *(uint *)(&as_pu_merge_list[0].field_0xc + uVar19) =
             *(uint *)(&as_pu_merge_list[0].field_0xc + uVar19) & 0xfff9ffff | uVar25;
        uVar29 = uVar29 + (byte)(avail_col_flag[1] != 0U | bVar34);
        if (uVar29 != uVar33 + 1) {
          cVar3 = psVar9->i1_slice_type;
          if (uVar29 - 2 < 3 && cVar3 == '\0') {
            uVar20 = (ulong)((uVar29 - 1) * uVar29);
            lVar27 = 0;
            while (uVar20 << 2 != lVar27) {
              iVar30 = *(int *)((long)&DAT_0016af80 + lVar27);
              if (((*(uint *)&as_pu_merge_list[iVar30].field_0xc & 0x60000) != 0x20000) &&
                 (iVar24 = *(int *)((long)&DAT_0016afb0 + lVar27),
                 (as_pu_merge_list[iVar24].field_0xe & 6) != 0)) {
                cVar4 = as_pu_merge_list[iVar30].mv.i1_l0_ref_idx;
                cVar21 = as_pu_merge_list[iVar24].mv.i1_l1_ref_idx;
                sVar5 = as_pu_merge_list[iVar30].mv.s_l0_mv.i2_mvx;
                sVar6 = as_pu_merge_list[iVar30].mv.s_l0_mv.i2_mvy;
                sVar7 = as_pu_merge_list[iVar24].mv.s_l1_mv.i2_mvx;
                sVar8 = as_pu_merge_list[iVar24].mv.s_l1_mv.i2_mvy;
                if ((*(int *)((long)psVar9->as_ref_pic_list0[cVar4].pv_pic_buf + 0x10) !=
                     *(int *)(*(long *)((long)psVar9->ai4_poc_lsb_lt +
                                       (long)cVar21 * 0x18 + lVar26 + -8) + 0x10)) ||
                   ((sVar5 != sVar7 || (sVar6 != sVar8)))) {
                  if (uVar29 == uVar33) {
                    (ps_pu->mv).s_l0_mv.i2_mvx = sVar5;
                    (ps_pu->mv).s_l0_mv.i2_mvy = sVar6;
                    (ps_pu->mv).s_l1_mv.i2_mvx = sVar7;
                    (ps_pu->mv).s_l1_mv.i2_mvy = sVar8;
                    (ps_pu->mv).i1_l0_ref_idx = cVar4;
                    (ps_pu->mv).i1_l1_ref_idx = cVar21;
                    *(uint *)&ps_pu->field_0xc = *(uint *)&ps_pu->field_0xc & 0xfff9ffff | 0x40000;
                    return;
                  }
                  uVar29 = uVar29 + 1;
                }
              }
              if ((uVar20 * 4 + -4 == lVar27) || (lVar27 = lVar27 + 4, uVar29 == 5)) break;
            }
          }
          iVar30 = uVar33 - uVar29;
          cVar4 = psVar9->i1_num_ref_idx_l0_active;
          cVar21 = cVar4;
          if ((cVar3 != '\x01') &&
             (cVar21 = psVar9->i1_num_ref_idx_l1_active, cVar4 < psVar9->i1_num_ref_idx_l1_active))
          {
            cVar21 = cVar4;
          }
          if (cVar21 <= iVar30) {
            iVar30 = 0;
          }
          uVar29 = *(uint *)&ps_pu->field_0xc & 0xfff9ffff;
          WVar28 = (WORD8)iVar30;
          (ps_pu->mv).i1_l0_ref_idx = WVar28;
          if (cVar3 == '\x01') {
            WVar28 = '\0';
          }
          uVar25 = uVar29 + 0x40000;
          if (cVar3 == '\x01') {
            uVar25 = uVar29;
          }
          (ps_pu->mv).i1_l1_ref_idx = WVar28;
          *(uint *)&ps_pu->field_0xc = uVar25;
          (ps_pu->mv).s_l0_mv.i2_mvx = 0;
          (ps_pu->mv).s_l0_mv.i2_mvy = 0;
          (ps_pu->mv).s_l1_mv.i2_mvx = 0;
          (ps_pu->mv).s_l1_mv.i2_mvy = 0;
          return;
        }
        uVar20 = (ulong)(uVar33 << 4);
        *(undefined4 *)&(ps_pu->mv).i1_l0_ref_idx =
             *(undefined4 *)(&as_pu_merge_list[0].mv.i1_l0_ref_idx + uVar20);
        uVar22 = *(undefined8 *)((long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20);
        uVar23 = (undefined4)uVar22;
        uVar10 = (undefined4)((ulong)uVar22 >> 0x20);
        (ps_pu->mv).s_l0_mv.i2_mvx = (short)uVar23;
        (ps_pu->mv).s_l0_mv.i2_mvy = (short)((uint)uVar23 >> 0x10);
        (ps_pu->mv).s_l1_mv.i2_mvx = (short)uVar10;
        (ps_pu->mv).s_l1_mv.i2_mvy = (short)((uint)uVar10 >> 0x10);
        as_pu_merge_list[0]._12_4_ = *(undefined4 *)(&as_pu_merge_list[0].field_0xc + uVar20);
        uVar25 = *(uint *)&ps_pu->field_0xc;
        goto LAB_0011e1a5;
      }
      if (bVar35) {
        uVar19 = uVar19 + 1;
      }
      else {
        uVar18 = ihevcd_compare_pu_t(ps_pu_2,ps_pu_2_00);
        uVar19 = (uVar18 ^ 1) + uVar19;
        if (uVar18 != 0) goto LAB_0011dca1;
      }
      uVar20 = (ulong)(uVar29 << 4);
      uVar22 = *(undefined8 *)&(ps_pu_2_00->mv).i1_l0_ref_idx;
      *(undefined8 *)((long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20) =
           *(undefined8 *)&ps_pu_2_00->mv;
      *(undefined8 *)(&as_pu_merge_list[0].mv.i1_l0_ref_idx + uVar20) = uVar22;
      if (uVar29 != uVar33) {
        uVar29 = uVar29 + 1;
        goto LAB_0011dca1;
      }
LAB_0011df0f:
      lVar26 = (long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20;
      uVar22._0_2_ = (ps_pu_2_00->mv).s_l0_mv.i2_mvx;
      uVar22._2_2_ = (ps_pu_2_00->mv).s_l0_mv.i2_mvy;
      uVar22._4_2_ = (ps_pu_2_00->mv).s_l1_mv.i2_mvx;
      uVar22._6_2_ = (ps_pu_2_00->mv).s_l1_mv.i2_mvy;
      uVar23._0_1_ = (ps_pu_2_00->mv).i1_l0_ref_idx;
      uVar23._1_1_ = (ps_pu_2_00->mv).i1_l1_ref_idx;
      uVar23._2_1_ = (ps_pu_2_00->mv).i1_l0_ref_pic_buf_id;
      uVar23._3_1_ = (ps_pu_2_00->mv).i1_l1_ref_pic_buf_id;
    }
    else {
      if (iVar1 >> (bVar2 & 0x1f) == iVar32 && part_wd + part_pos_x + -1 >> (bVar2 & 0x1f) == iVar24
         ) {
        bVar11 = false;
        goto LAB_0011dc3f;
      }
      if (((part_idx == 1 && single_mcl_flag == 0) && ((uint)part_mode < 6)) &&
         ((0x32U >> (part_mode & 0x1fU) & 1) != 0)) goto LAB_0011dc3a;
      if (bVar34) {
        uVar19 = uVar29 + 1;
      }
      else {
        uVar18 = ihevcd_compare_pu_t(ps_pu_1,ps_pu_2);
        uVar19 = (uVar18 ^ 1) + uVar29;
        if (uVar18 != 0) {
          bVar11 = true;
          bVar35 = false;
          goto LAB_0011dc3f;
        }
      }
      uVar20 = (ulong)(uVar29 << 4);
      uVar22 = *(undefined8 *)&(ps_pu_2->mv).i1_l0_ref_idx;
      *(undefined8 *)((long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20) =
           *(undefined8 *)&ps_pu_2->mv;
      *(undefined8 *)(&as_pu_merge_list[0].mv.i1_l0_ref_idx + uVar20) = uVar22;
      if (uVar29 != uVar33) {
        uVar29 = uVar29 + 1;
        bVar11 = true;
        bVar35 = false;
        goto LAB_0011dc3f;
      }
      lVar26 = (long)&as_pu_merge_list[0].mv.s_l0_mv.i2_mvx + uVar20;
      uVar22._0_2_ = (ps_pu_2->mv).s_l0_mv.i2_mvx;
      uVar22._2_2_ = (ps_pu_2->mv).s_l0_mv.i2_mvy;
      uVar22._4_2_ = (ps_pu_2->mv).s_l1_mv.i2_mvx;
      uVar22._6_2_ = (ps_pu_2->mv).s_l1_mv.i2_mvy;
      uVar23._0_1_ = (ps_pu_2->mv).i1_l0_ref_idx;
      uVar23._1_1_ = (ps_pu_2->mv).i1_l1_ref_idx;
      uVar23._2_1_ = (ps_pu_2->mv).i1_l0_ref_pic_buf_id;
      uVar23._3_1_ = (ps_pu_2->mv).i1_l1_ref_pic_buf_id;
    }
LAB_0011e371:
    (ps_pu->mv).i1_l0_ref_idx = (char)uVar23;
    (ps_pu->mv).i1_l1_ref_idx = (char)((uint)uVar23 >> 8);
    (ps_pu->mv).i1_l0_ref_pic_buf_id = (char)((uint)uVar23 >> 0x10);
    (ps_pu->mv).i1_l1_ref_pic_buf_id = (char)((uint)uVar23 >> 0x18);
    uVar23 = (undefined4)((ulong)uVar22 >> 0x20);
    (ps_pu->mv).s_l0_mv.i2_mvx = (short)(int)uVar22;
    (ps_pu->mv).s_l0_mv.i2_mvy = (short)((uint)(int)uVar22 >> 0x10);
    (ps_pu->mv).s_l1_mv.i2_mvx = (short)uVar23;
    (ps_pu->mv).s_l1_mv.i2_mvy = (short)((uint)uVar23 >> 0x10);
    *(uint *)&ps_pu->field_0xc = uVar25 & 0xfff9ffff | *(uint *)(lVar26 + 0xc) & 0x60000;
  }
  return;
}

Assistant:

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,
                     UWORD32 *pu4_top_pu_idx,
                     UWORD32 *pu4_left_pu_idx,
                     WORD32 left_nbr_4x4_strd,
                     pu_t *ps_pu,
                     WORD32 part_mode,
                     WORD32 part_idx,
                     WORD32 part_wd,
                     WORD32 part_ht,
                     WORD32 part_pos_x,
                     WORD32 part_pos_y,
                     WORD32 single_mcl_flag,
                     WORD32 lb_avail,
                     WORD32 l_avail,
                     WORD32 tr_avail,
                     WORD32 t_avail,
                     WORD32 tl_avail)
{
    /******************************************************/
    /*      Spatial Merge Candidates                      */
    /******************************************************/
    slice_header_t *ps_slice_hdr;
    pu_t as_pu_merge_list[MAX_NUM_MERGE_CAND];
    pps_t *ps_pps;
    ref_list_t *ps_ref_list[2];
    WORD32 sum_avail_a0_a1_b0_b1 = 0; /*Sum of availability of A0, A1, B0, B1*/
    WORD32 nbr_x, nbr_y;
    WORD32 nbr_avail[MAX_NUM_MV_NBR];
    WORD32 merge_shift;
    WORD32 nbr_pu_idx;
    pu_t *ps_nbr_pu[MAX_NUM_MV_NBR];
    WORD32 max_num_merge_cand;
    WORD32 candidate_cnt;
    WORD32 pos_x_merge_shift, pos_y_merge_shift;

    ps_slice_hdr = ps_mv_ctxt->ps_slice_hdr;
    ps_pps = ps_mv_ctxt->ps_pps;
    /* Initializing reference list */
    ps_ref_list[0] = ps_slice_hdr->as_ref_pic_list0;
    ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list1;
    if(PSLICE == ps_slice_hdr->i1_slice_type)
        ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list0;

    candidate_cnt = 0;
    /*******************************************/
    /* Neighbor location: Graphical indication */
    /*                                         */
    /*          B2 _____________B1 B0          */
    /*            |               |            */
    /*            |               |            */
    /*            |               |            */
    /*            |      PU     ht|            */
    /*            |               |            */
    /*            |               |            */
    /*          A1|______wd_______|            */
    /*          A0                             */
    /*                                         */
    /*******************************************/

    merge_shift = ps_pps->i1_log2_parallel_merge_level;

    /* Availability check */
    /* A1 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht - 1; /* A1 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A1] = l_avail
                    && (!ps_nbr_pu[NBR_A1]->b1_intra_flag); /* A1 */

    pos_x_merge_shift = (part_pos_x >> merge_shift);
    pos_y_merge_shift = (part_pos_y >> merge_shift);
    max_num_merge_cand = ps_pu->b3_merge_idx + 1;

    {
        if(nbr_avail[NBR_A1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A1] = 0;
            }

            /* SPEC JCTVC-K1003_v9 version has a different way using not available       */
            /* candidates compared to software. for non square part and seconf part case */
            /* ideally nothing from the 1st partition should be used as per spec but     */
            /* HM 8.2 dev verison does not adhere to this. currenlty code fllows HM      */

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_Nx2N) || (part_mode == PART_nLx2N) ||
                                            (part_mode == PART_nRx2N)))
            {
                nbr_avail[NBR_A1] = 0;
            }
            sum_avail_a0_a1_b0_b1 += nbr_avail[NBR_A1];
            if(nbr_avail[NBR_A1])
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /* B1 */
    nbr_x = part_pos_x + part_wd - 1;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B1] = t_avail
                    && (!ps_nbr_pu[NBR_B1]->b1_intra_flag); /* B1 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B1];

        if(nbr_avail[NBR_B1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_2NxN) || (part_mode == PART_2NxnU) ||
                                            (part_mode == PART_2NxnD)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B1]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B0 */
    nbr_x = part_pos_x + part_wd;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B0] = tr_avail
                    && (!ps_nbr_pu[NBR_B0]->b1_intra_flag); /* B0 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B0];

        /* if at same merge level */
        if(nbr_avail[NBR_B0])
        {
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_B1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* A0 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht; /* A0 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A0] = lb_avail
                    && (!ps_nbr_pu[NBR_A0]->b1_intra_flag); /* A0 */
    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_A0];

        if(nbr_avail[NBR_A0])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_A0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B2 */

    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y - 1; /* B2 */

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B2] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B2] = tl_avail
                    && (!ps_nbr_pu[NBR_B2]->b1_intra_flag); /* B2 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B2];

        if(nbr_avail[NBR_B2])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B2] = 0;
                avail_flag = 0;
            }
            else if(4 == sum_avail_a0_a1_b0_b1)
            {
                avail_flag = 0;
            }

            else
            {
                if(nbr_avail[NBR_A1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B2]);
                }

                if(avail_flag && nbr_avail[NBR_B1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B2]);
                }
            }

            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B2];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /***********************************************************/
    /*          Collocated MV prediction                       */
    /***********************************************************/
    {
        mv_t as_mv_col[2];
        WORD32 avail_col_flag[2] = { 0 }, x_col, y_col;
        WORD32 avail_col_l0, avail_col_l1;
//        ihevcd_collocated_mvp(ps_mv_ctxt,ps_pu,part_pos_x,part_pos_y,part_wd,part_ht,as_mv_col,avail_col_flag,0);

        /* Checking Collocated MV availability at Bottom right of PU*/
        x_col = part_pos_x + part_wd;
        y_col = part_pos_y + part_ht;
        ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

        avail_col_l0 = avail_col_flag[0];
        avail_col_l1 = avail_col_flag[1];

        if(avail_col_l0 || avail_col_l1)
        {
            as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
        }

        if(avail_col_l0 == 0 || avail_col_l1 == 0)
        {
            /* Checking Collocated MV availability at Center of PU */
            x_col = part_pos_x + (part_wd >> 1);
            y_col = part_pos_y + (part_ht >> 1);
            ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

            if(avail_col_l0 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            }
            if(avail_col_l1 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
            }

            avail_col_l0 |= avail_col_flag[0];
            avail_col_l1 |= avail_col_flag[1];
        }

        as_pu_merge_list[candidate_cnt].mv.i1_l0_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].mv.i1_l1_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].b2_pred_mode = avail_col_l0 ? (avail_col_l1 ? PRED_BI : PRED_L0) : PRED_L1;

        candidate_cnt += (avail_col_l0 || avail_col_l1);

        if(candidate_cnt == max_num_merge_cand)
        {
            ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
            ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
            return;
        }

    }
    {
        WORD32 slice_type;

        slice_type = ps_slice_hdr->i1_slice_type;
        /* Colocated mv has to be added to list, if available */

        /******************************************************/
        /*      Bi pred merge candidates                      */
        /******************************************************/
        if(slice_type == BSLICE)
        {
            if((candidate_cnt > 1) && (candidate_cnt < MAX_NUM_MERGE_CAND))
            {
                WORD32 priority_list0[12] =
                    { 0, 1, 0, 2, 1, 2, 0, 3, 1, 3, 2, 3 };
                WORD32 priority_list1[12] =
                    { 1, 0, 2, 0, 2, 1, 3, 0, 3, 1, 3, 2 };
                WORD32 l0_cand, l1_cand;
                WORD32 bi_pred_idx = 0;
                WORD32 total_bi_pred_cand =
                                candidate_cnt * (candidate_cnt - 1);

                while(bi_pred_idx < total_bi_pred_cand)
                {
                    l0_cand = priority_list0[bi_pred_idx];
                    l1_cand = priority_list1[bi_pred_idx];

                    if((as_pu_merge_list[l0_cand].b2_pred_mode != PRED_L1)
                                    && (as_pu_merge_list[l1_cand].b2_pred_mode
                                                    != PRED_L0))
                    {
                        WORD8 i1_l0_ref_idx, i1_l1_ref_idx;
                        mv_t s_l0_mv, s_l1_mv;
                        pic_buf_t *ps_pic_buf_l0, *ps_pic_buf_l1;

                        i1_l0_ref_idx = as_pu_merge_list[l0_cand].mv.i1_l0_ref_idx;
                        i1_l1_ref_idx = as_pu_merge_list[l1_cand].mv.i1_l1_ref_idx;
                        ps_pic_buf_l0 = (pic_buf_t *)((ps_ref_list[0][i1_l0_ref_idx].pv_pic_buf));
                        ps_pic_buf_l1 = (pic_buf_t *)((ps_ref_list[1][i1_l1_ref_idx].pv_pic_buf));
                        s_l0_mv = as_pu_merge_list[l0_cand].mv.s_l0_mv;
                        s_l1_mv = as_pu_merge_list[l1_cand].mv.s_l1_mv;

                        if((ps_pic_buf_l0->i4_abs_poc != ps_pic_buf_l1->i4_abs_poc)
                                        || (s_l0_mv.i2_mvx != s_l1_mv.i2_mvx)
                                        || (s_l0_mv.i2_mvy != s_l1_mv.i2_mvy))
                        {
                            candidate_cnt++;
                            if(candidate_cnt == max_num_merge_cand)
                            {
                                ps_pu[0].mv.s_l0_mv = s_l0_mv;
                                ps_pu[0].mv.s_l1_mv = s_l1_mv;
                                ps_pu[0].mv.i1_l0_ref_idx = i1_l0_ref_idx;
                                ps_pu[0].mv.i1_l1_ref_idx = i1_l1_ref_idx;
                                ps_pu[0].b2_pred_mode = PRED_BI;
                                return;
                            }
                        }
                    }

                    bi_pred_idx++;

                    if((bi_pred_idx == total_bi_pred_cand)
                                    || (candidate_cnt == MAX_NUM_MERGE_CAND))
                    {
                        break;
                    }
                }
            }
        }

        /******************************************************/
        /*      Zero merge candidates                         */
        /******************************************************/
//        if(candidate_cnt < max_num_merge_cand)
        {
            WORD32 num_ref_idx;
            WORD32 zero_idx;

            zero_idx = max_num_merge_cand - candidate_cnt - 1;

            if(slice_type == PSLICE)
                num_ref_idx = ps_slice_hdr->i1_num_ref_idx_l0_active;
            else
                /* Slice type B */
                num_ref_idx = MIN(ps_slice_hdr->i1_num_ref_idx_l0_active, ps_slice_hdr->i1_num_ref_idx_l1_active);

            if(zero_idx >= num_ref_idx)
                zero_idx = 0;

            ps_pu[0].mv.i1_l0_ref_idx = zero_idx;
            if(slice_type == PSLICE)
            {
                ps_pu[0].mv.i1_l1_ref_idx = 0;
                ps_pu[0].b2_pred_mode = PRED_L0;
            }
            else /* Slice type B */
            {
                ps_pu[0].mv.i1_l1_ref_idx = zero_idx;
                ps_pu[0].b2_pred_mode = PRED_BI;
            }

            ps_pu[0].mv.s_l0_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l0_mv.i2_mvy = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvy = 0;

            candidate_cnt++;
        }
    }

    return;
}